

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL MoveFileExW(LPCWSTR lpExistingFileName,LPCWSTR lpNewFileName,DWORD dwFlags)

{
  long lVar1;
  int iVar2;
  DWORD DVar3;
  size_t sVar4;
  char *lpMultiByteStr;
  char *lpMultiByteStr_00;
  long in_FS_OFFSET;
  DWORD dwLastError_1;
  DWORD dwLastError;
  BOOL bRet;
  int dest_size;
  int src_size;
  int length;
  char *dest;
  char *source;
  CPalThread *pThread;
  DWORD dwFlags_local;
  LPCWSTR lpNewFileName_local;
  LPCWSTR lpExistingFileName_local;
  PathCharString destPS;
  PathCharString sourcePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&destPS.m_count);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpExistingFileName_local);
  dest_size = 0;
  dwLastError_1 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpExistingFileName != (LPCWSTR)0x0) {
    sVar4 = PAL_wcslen(lpExistingFileName);
    dest_size = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
  }
  lpMultiByteStr =
       StackString<32UL,_char>::OpenStringBuffer
                 ((StackString<32UL,_char> *)&destPS.m_count,(long)dest_size);
  if (lpMultiByteStr == (char *)0x0) {
    CorUnix::CPalThread::SetLastError(8);
  }
  else {
    iVar2 = WideCharToMultiByte(0,0,lpExistingFileName,-1,lpMultiByteStr,dest_size,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&destPS.m_count,(long)iVar2);
    if (iVar2 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        CorUnix::CPalThread::SetLastError(0xce);
      }
      else {
        fprintf(_stderr,"] %s %s:%d","MoveFileExW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x648);
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
        CorUnix::CPalThread::SetLastError(0x54f);
      }
    }
    else {
      dest_size = 0;
      if (lpNewFileName != (LPCWSTR)0x0) {
        sVar4 = PAL_wcslen(lpNewFileName);
        dest_size = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
      }
      lpMultiByteStr_00 =
           StackString<32UL,_char>::OpenStringBuffer
                     ((StackString<32UL,_char> *)&lpExistingFileName_local,(long)dest_size);
      if (lpMultiByteStr_00 == (char *)0x0) {
        CorUnix::CPalThread::SetLastError(8);
      }
      else {
        iVar2 = WideCharToMultiByte(0,0,lpNewFileName,-1,lpMultiByteStr_00,dest_size,(LPCSTR)0x0,
                                    (LPBOOL)0x0);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)&lpExistingFileName_local,(long)iVar2);
        if (iVar2 == 0) {
          DVar3 = GetLastError();
          if (DVar3 == 0x7a) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CorUnix::CPalThread::SetLastError(0xce);
          }
          else {
            fprintf(_stderr,"] %s %s:%d","MoveFileExW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                    ,0x668);
            fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
            CorUnix::CPalThread::SetLastError(0x54f);
          }
        }
        else {
          dwLastError_1 = MoveFileExA(lpMultiByteStr,lpMultiByteStr_00,dwFlags);
        }
      }
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpExistingFileName_local);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return dwLastError_1;
  }
  abort();
}

Assistant:

BOOL
PALAPI
MoveFileExW(
        IN LPCWSTR lpExistingFileName,
        IN LPCWSTR lpNewFileName,
        IN DWORD dwFlags)
{
    CPalThread *pThread;
    PathCharString sourcePS;
    PathCharString destPS;
    char * source;
    char * dest;
    int length = 0;
    int     src_size,dest_size;
    BOOL        bRet = FALSE;

    PERF_ENTRY(MoveFileExW);
    ENTRY("MoveFileExW(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), dwFlags=%#x)\n",
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING, dwFlags);

    pThread = InternalGetCurrentThread();
    
    if (lpExistingFileName != NULL)
    {
        length = (PAL_wcslen(lpExistingFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    source = sourcePS.OpenStringBuffer(length);
    if (NULL == source)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    src_size = WideCharToMultiByte( CP_ACP, 0, lpExistingFileName, -1, source, length,
                                NULL, NULL );
    sourcePS.CloseBuffer(src_size);
    if( src_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpExistingFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    length = 0;
    if (lpNewFileName != NULL)
    {
        length = (PAL_wcslen(lpNewFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    dest = destPS.OpenStringBuffer(length);
    if (NULL == dest)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    dest_size = WideCharToMultiByte( CP_ACP, 0, lpNewFileName, -1, dest, length,
                                NULL, NULL );
    destPS.CloseBuffer(dest_size);
    
    if( dest_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpNewFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    bRet = MoveFileExA(source,dest,dwFlags);

done:
    LOGEXIT("MoveFileExW returns BOOL %d\n", bRet);
    PERF_EXIT(MoveFileExW);
    return bRet;
}